

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O2

void sysbvm_dictionary_add
               (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t association)

{
  ulong uVar1;
  long lVar2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_053a9f48 gcFrame;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if ((dictionary & 0xf) == 0 && dictionary != 0) {
    local_20 = (undefined1 *)&gcFrame;
    gcFrame.key = 0;
    gcFrame.association = 0;
    local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_38._12_4_ = 0;
    local_28 = 4;
    gcFrame.dictionary = (sysbvm_dictionary_t *)dictionary;
    gcFrame.associationToInsert = association;
    sysbvm_stackFrame_pushRecord(&local_38);
    gcFrame.key = sysbvm_association_getKey(gcFrame.associationToInsert);
    lVar2 = sysbvm_dictionary_scanFor(context,&gcFrame.dictionary,&gcFrame.key);
    if (lVar2 < 0) {
      sysbvm_dictionary_increaseCapacity(context,&gcFrame.dictionary);
      lVar2 = sysbvm_dictionary_scanFor(context,&gcFrame.dictionary,&gcFrame.key);
      if (lVar2 < 0) {
        sysbvm_error("Dictionary out of memory.");
        lVar2 = -1;
      }
    }
    gcFrame.association = *(sysbvm_tuple_t *)((gcFrame.dictionary)->storage + 0x10 + lVar2 * 8);
    if (gcFrame.association == 0) {
      *(sysbvm_tuple_t *)((gcFrame.dictionary)->storage + 0x10 + lVar2 * 8) =
           gcFrame.associationToInsert;
      uVar4 = (gcFrame.dictionary)->storage;
      if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
        uVar4 = (ulong)(*(uint *)(uVar4 + 0xc) >> 1 & 0xfffffffc) / 5;
      }
      else {
        uVar4 = 0;
      }
      uVar1 = (gcFrame.dictionary)->size;
      if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
        lVar2 = (long)uVar1 >> 4;
      }
      else {
        lVar2 = *(long *)(uVar1 + 0x10);
      }
      sVar3 = sysbvm_tuple_size_encode(context,lVar2 + 1U);
      (gcFrame.dictionary)->size = sVar3;
      if (uVar4 <= lVar2 + 1U) {
        sysbvm_dictionary_increaseCapacity(context,&gcFrame.dictionary);
      }
    }
    else {
      gcFrame.association = gcFrame.associationToInsert;
    }
    sysbvm_stackFrame_popRecord(&local_38);
  }
  return;
}

Assistant:

SYSBVM_INLINE bool sysbvm_tuple_isNonNullPointer(sysbvm_tuple_t tuple)
{
    return (tuple != 0) & ((tuple & SYSBVM_TUPLE_TAG_BIT_MASK) == SYSBVM_TUPLE_TAG_POINTER);
}